

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

Real __thiscall amrex::MultiFab::max(MultiFab *this,int comp,int nghost,bool local)

{
  bool bVar1;
  int i;
  FabType FVar2;
  EBFArrayBoxFactory *this_00;
  FabArray<amrex::EBCellFlagFab> *this_01;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  int j_1;
  long lVar16;
  double dVar17;
  Real local_168;
  Box local_14c;
  long local_130;
  FabArray<amrex::EBCellFlagFab> *local_128;
  long local_120;
  long local_118;
  Array4<const_double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter mfi;
  
  bVar1 = FabArray<amrex::FArrayBox>::hasEBFabFactory(&this->super_FabArray<amrex::FArrayBox>);
  if (bVar1) {
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast((this->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    if (this_00 == (EBFArrayBoxFactory *)0x0) {
      __cxa_bad_cast();
    }
    this_01 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_00);
    MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
    local_130 = (long)comp << 3;
    local_168 = -1.79769313486232e+308;
    local_128 = this_01;
    while( true ) {
      if (mfi.endIndex <= mfi.currentIndex) break;
      MFIter::growntilebox(&local_14c,&mfi,nghost);
      piVar3 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar3 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      FVar2 = EBCellFlagFab::getType
                        ((this_01->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar3],&local_14c);
      if (FVar2 != covered) {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>(&local_d0,this_01,&mfi)
        ;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,&this->super_FabArray<amrex::FArrayBox>,&mfi);
        lVar4 = (long)local_14c.smallend.vect[0];
        local_118 = (long)local_14c.smallend.vect[1];
        lVar6 = (long)local_14c.smallend.vect[2];
        local_120 = local_d0.kstride * 4;
        lVar9 = CONCAT44(local_110.kstride._4_4_,(int)local_110.kstride) * 8;
        lVar10 = CONCAT44(local_110.jstride._4_4_,(int)local_110.jstride) * 8;
        lVar16 = (long)&local_d0.p[lVar4 - local_d0.begin.x].flag +
                 (local_118 - local_d0.begin.y) * local_d0.jstride * 4 +
                 (lVar6 - local_d0.begin.z) * local_120;
        lVar7 = local_110.nstride * local_130 +
                (local_118 - local_110.begin.y) * lVar10 + (lVar6 - local_110.begin.z) * lVar9 +
                lVar4 * 8 + (long)local_110.begin.x * -8 +
                CONCAT44(local_110.p._4_4_,(int)local_110.p);
        for (; lVar5 = local_118, lVar11 = lVar16, lVar15 = lVar7, this_01 = local_128,
            lVar6 <= local_14c.bigend.vect[2]; lVar6 = lVar6 + 1) {
          for (; lVar5 <= local_14c.bigend.vect[1]; lVar5 = lVar5 + 1) {
            for (lVar13 = 0; lVar4 + lVar13 <= (long)local_14c.bigend.vect[0]; lVar13 = lVar13 + 1)
            {
              dVar17 = local_168;
              if (((~*(uint *)(lVar11 + lVar13 * 4) & 3) != 0) &&
                 (dVar17 = *(double *)(lVar15 + lVar13 * 8), dVar17 <= local_168)) {
                dVar17 = local_168;
              }
              local_168 = dVar17;
            }
            lVar11 = lVar11 + local_d0.jstride * 4;
            lVar15 = lVar15 + lVar10;
          }
          lVar16 = lVar16 + local_120;
          lVar7 = lVar7 + lVar9;
        }
      }
      MFIter::operator++(&mfi);
    }
  }
  else {
    MFIter::MFIter(&mfi,(FabArrayBase *)this,true);
    local_168 = -1.79769313486232e+308;
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::growntilebox((Box *)&local_110,&mfi,nghost);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_d0,&this->super_FabArray<amrex::FArrayBox>,&mfi);
      lVar4 = (long)(int)local_110.jstride;
      pdVar14 = (double *)
                ((long)&local_d0.p[(long)local_d0.begin.x * -2 + (long)(int)local_110.p * 2].flag +
                local_d0.nstride * (long)comp * 8 +
                (lVar4 - local_d0.begin.z) * local_d0.kstride * 8 +
                ((long)local_110.p._4_4_ - (long)local_d0.begin.y) * local_d0.jstride * 8);
      for (; pdVar12 = pdVar14, lVar6 = (long)local_110.p._4_4_, lVar4 <= local_110.kstride._4_4_;
          lVar4 = lVar4 + 1) {
        for (; lVar7 = (long)(int)local_110.p, pdVar8 = pdVar12, lVar6 <= (int)local_110.kstride;
            lVar6 = lVar6 + 1) {
          for (; lVar7 <= local_110.jstride._4_4_; lVar7 = lVar7 + 1) {
            dVar17 = *pdVar8;
            if (*pdVar8 <= local_168) {
              dVar17 = local_168;
            }
            pdVar8 = pdVar8 + 1;
            local_168 = dVar17;
          }
          pdVar12 = pdVar12 + local_d0.jstride;
        }
        pdVar14 = pdVar14 + local_d0.kstride;
      }
      MFIter::operator++(&mfi);
    }
  }
  MFIter::~MFIter(&mfi);
  return local_168;
}

Assistant:

Real
MultiFab::max (int comp, int nghost, bool local) const
{
    BL_ASSERT(nghost >= 0 && nghost <= n_grow.min());

    BL_PROFILE("MultiFab::max()");

    Real mx = std::numeric_limits<Real>::lowest();

#ifdef AMREX_USE_EB
    if ( this->hasEBFabFactory() )
    {
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(this->Factory());
        auto const& flags = ebfactory.getMultiEBCellFlagFab();
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            auto const& flagsma = flags.const_arrays();
            auto const& ma = this->const_arrays();
            mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
            {
                if (flagsma[box_no](i,j,k).isCovered()) {
                    return AMREX_REAL_LOWEST;
                } else {
                    return ma[box_no](i,j,k,comp);
                }
            });
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
            for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
                Box const& bx = mfi.growntilebox(nghost);
                if (flags[mfi].getType(bx) != FabType::covered) {
                    auto const& flag = flags.const_array(mfi);
                    auto const& a = this->const_array(mfi);
                    AMREX_LOOP_3D(bx, i, j, k,
                    {
                        if (!flag(i,j,k).isCovered()) {
                            mx = std::max(mx, a(i,j,k,comp));
                        }
                    });
                }
            }
        }
    }
    else
#endif
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion()) {
            auto const& ma = this->const_arrays();
            mx = ParReduce(TypeList<ReduceOpMax>{}, TypeList<Real>{}, *this, IntVect(nghost),
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
            {
                return ma[box_no](i,j,k,comp);
            });
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel reduction(max:mx)
#endif
            for (MFIter mfi(*this,true); mfi.isValid(); ++mfi) {
                Box const& bx = mfi.growntilebox(nghost);
                auto const& a = this->const_array(mfi);
                AMREX_LOOP_3D(bx, i, j, k,
                {
                    mx = std::max(mx, a(i,j,k,comp));
                });
            }
        }
    }

    if (!local) {
        ParallelAllReduce::Max(mx, ParallelContext::CommunicatorSub());
    }

    return mx;
}